

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<int_*,_10> * __thiscall
TPZManVector<int_*,_10>::operator=(TPZManVector<int_*,_10> *this,TPZManVector<int_*,_10> *rval)

{
  ulong uVar1;
  int **ppiVar2;
  int iVar3;
  ulong uVar4;
  int **ppiVar5;
  
  if (this == rval) goto LAB_00b2c5ac;
  uVar1 = (rval->super_TPZVec<int_*>).fNElements;
  ppiVar2 = (this->super_TPZVec<int_*>).fStore;
  ppiVar5 = this->fExtAlloc;
  if (ppiVar2 != ppiVar5 && ppiVar2 != (int **)0x0) {
    operator_delete__(ppiVar2);
    (this->super_TPZVec<int_*>).fStore = (int **)0x0;
  }
  if ((long)uVar1 < 0xb) {
    uVar4 = 0;
    iVar3 = 0;
    if (0 < (long)uVar1) {
      do {
        ppiVar5[uVar4] = rval->fExtAlloc[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      iVar3 = (int)uVar1;
      if (9 < uVar1) {
        uVar4 = 0;
        goto LAB_00b2c5a0;
      }
    }
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar3 * 8)),0,
           (ulong)(iVar3 * -8 + 0x48) + 8);
    uVar4 = 0;
  }
  else {
    ppiVar5 = (rval->super_TPZVec<int_*>).fStore;
    uVar4 = uVar1;
  }
LAB_00b2c5a0:
  (this->super_TPZVec<int_*>).fStore = ppiVar5;
  (this->super_TPZVec<int_*>).fNAlloc = uVar4;
  (this->super_TPZVec<int_*>).fNElements = uVar1;
LAB_00b2c5ac:
  (rval->super_TPZVec<int_*>).fStore = (int **)0x0;
  (rval->super_TPZVec<int_*>).fNElements = 0;
  (rval->super_TPZVec<int_*>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}